

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O1

void __thiscall flow::lang::Lexer::Lexer(Lexer *this,Report *report)

{
  this->report_ = report;
  (this->contexts_).
  super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (this->contexts_).
  super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (this->contexts_).
  super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contexts_;
  (this->contexts_).
  super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contexts_;
  (this->contexts_).
  super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->currentChar_ = -1;
  this->ipv6HexDigits_ = 0;
  (this->lastLocation_).filename._M_dataplus._M_p = (pointer)&(this->lastLocation_).filename.field_2
  ;
  (this->lastLocation_).filename._M_string_length = 0;
  (this->lastLocation_).filename.field_2._M_local_buf[0] = '\0';
  (this->lastLocation_).begin.line = 1;
  (this->lastLocation_).begin.column = 1;
  *(undefined8 *)&(this->lastLocation_).begin.offset = 0x100000000;
  (this->lastLocation_).end.column = 1;
  (this->lastLocation_).end.offset = 0;
  (this->location_).filename._M_dataplus._M_p = (pointer)&(this->location_).filename.field_2;
  (this->location_).filename._M_string_length = 0;
  (this->location_).filename.field_2._M_local_buf[0] = '\0';
  (this->location_).begin.line = 1;
  (this->location_).begin.column = 1;
  *(undefined8 *)&(this->location_).begin.offset = 0x100000000;
  (this->location_).end.column = 1;
  (this->location_).end.offset = 0;
  this->token_ = Eof;
  (this->stringValue_)._M_dataplus._M_p = (pointer)&(this->stringValue_).field_2;
  (this->stringValue_)._M_string_length = 0;
  (this->stringValue_).field_2._M_local_buf[0] = '\0';
  (this->ipValue_).family_ = V4;
  (this->ipValue_).cstr_[0] = '\0';
  (this->ipValue_).buf_[0] = '\0';
  (this->ipValue_).buf_[1] = '\0';
  (this->ipValue_).buf_[2] = '\0';
  (this->ipValue_).buf_[3] = '\0';
  (this->ipValue_).buf_[4] = '\0';
  (this->ipValue_).buf_[5] = '\0';
  (this->ipValue_).buf_[6] = '\0';
  (this->ipValue_).buf_[7] = '\0';
  (this->ipValue_).buf_[8] = '\0';
  (this->ipValue_).buf_[9] = '\0';
  (this->ipValue_).buf_[10] = '\0';
  (this->ipValue_).buf_[0xb] = '\0';
  (this->ipValue_).buf_[0xc] = '\0';
  (this->ipValue_).buf_[0xd] = '\0';
  (this->ipValue_).buf_[0xe] = '\0';
  (this->ipValue_).buf_[0xf] = '\0';
  this->numberValue_ = 0;
  this->interpolationDepth_ = 0;
  return;
}

Assistant:

Lexer::Lexer(diagnostics::Report* report)
    : report_{*report},
      contexts_(),
      currentChar_(EOF),
      ipv6HexDigits_(0),
      location_(),
      token_(Token::Eof),
      stringValue_(),
      ipValue_(),
      numberValue_(0),
      interpolationDepth_(0) {}